

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Induction.cpp
# Opt level: O0

void __thiscall
Inferences::InductionClauseIterator::performStructInductionFreeVar
          (InductionClauseIterator *this,InductionContext *context,Entry *e,
          Substitution *freeVarSubst)

{
  TermList sort;
  TermList elem;
  initializer_list<Kernel::TermList> __l;
  initializer_list<Kernel::TermList> __l_00;
  initializer_list<Kernel::TermList> __l_01;
  bool bVar1;
  uint uVar2;
  uint uVar3;
  size_type sVar4;
  Formula *pFVar5;
  void *pvVar6;
  List<Kernel::TermList> *this_00;
  ClauseStack *cls;
  QuantifiedFormula *this_01;
  Term *__addr;
  socklen_t __len;
  Substitution *in_RCX;
  vector<Kernel::Term_*,_std::allocator<Kernel::Term_*>_> *in_RSI;
  Term *xSkolem;
  ClauseStack hyp_clauses;
  DHMap<unsigned_int,_Kernel::Term_*,_Lib::DefaultHash,_Lib::DefaultHash2> bindings;
  Formula *conclusion;
  Substitution subst;
  TermList x;
  uint xvar;
  TermList z;
  Formula *formula;
  Formula *step;
  Formula *consequent;
  Term *tcons;
  TermList u;
  Formula *curLit;
  TermList w;
  TermList y;
  uint j;
  FormulaList *hyps;
  TermStack argTerms;
  uint arity;
  TermAlgebraConstructor *con;
  uint i;
  FormulaList *formulas;
  VList *ys;
  VList *ws;
  VList *us;
  value_type *kv;
  const_iterator __end1;
  const_iterator __begin1;
  unordered_map<Kernel::Clause_*,_Lib::Stack<Kernel::Literal_*>,_Inferences::StlClauseHash,_std::equal_to<Kernel::Clause_*>,_std::allocator<std::pair<Kernel::Clause_*const,_Lib::Stack<Kernel::Literal_*>_>_>_>
  *__range1;
  uint var;
  uint freeVar;
  TermAlgebra *ta;
  Signature *in_stack_fffffffffffffbf8;
  undefined4 in_stack_fffffffffffffc00;
  uint in_stack_fffffffffffffc04;
  DHMap<unsigned_int,_Kernel::Term_*,_Lib::DefaultHash,_Lib::DefaultHash2>
  *in_stack_fffffffffffffc08;
  BinaryFormula *in_stack_fffffffffffffc10;
  undefined8 in_stack_fffffffffffffc18;
  Connective con_00;
  List<unsigned_int> *pLVar7;
  Clause *in_stack_fffffffffffffc20;
  allocator_type *in_stack_fffffffffffffc28;
  undefined7 in_stack_fffffffffffffc30;
  undefined1 in_stack_fffffffffffffc37;
  iterator in_stack_fffffffffffffc38;
  size_type in_stack_fffffffffffffc40;
  undefined7 in_stack_fffffffffffffc50;
  undefined1 in_stack_fffffffffffffc57;
  TermList *in_stack_fffffffffffffc58;
  undefined8 in_stack_fffffffffffffc60;
  vector<Kernel::TermList,_std::allocator<Kernel::TermList>_> *in_stack_fffffffffffffc68;
  InductionContext *in_stack_fffffffffffffc70;
  Term *in_stack_fffffffffffffc78;
  undefined4 in_stack_fffffffffffffc80;
  TermList *in_stack_fffffffffffffcb0;
  uint in_stack_fffffffffffffcb8;
  uint in_stack_fffffffffffffcbc;
  Formula *local_318;
  DHMap<unsigned_int,_Kernel::Term_*,_Lib::DefaultHash,_Lib::DefaultHash2> local_248;
  uint64_t local_218;
  uint64_t *local_210;
  undefined8 local_208;
  Formula *local_1e8;
  int local_1ac;
  TermList local_1a8;
  ClauseStack *local_1a0;
  undefined1 local_191;
  Formula *local_190;
  Formula *local_188;
  undefined1 local_178 [8];
  undefined1 *local_170;
  undefined8 local_168;
  Formula *local_148;
  Term *local_140;
  TermList local_138 [2];
  undefined1 local_128 [8];
  undefined1 *local_120;
  undefined8 local_118;
  Formula *local_f8;
  TermList local_f0;
  TermList local_e8;
  TermList local_e0;
  TermList in_stack_ffffffffffffff28;
  TermList in_stack_ffffffffffffff30;
  uint local_c8;
  InferenceRule in_stack_ffffffffffffff3f;
  Formula *in_stack_ffffffffffffff40;
  InductionClauseIterator *in_stack_ffffffffffffff48;
  Stack<Kernel::TermList> local_b0;
  uint local_8c;
  TermAlgebraConstructor *local_88;
  uint local_7c;
  List<Kernel::Formula_*> *local_78;
  List<unsigned_int> *local_70;
  List<unsigned_int> *local_68;
  List<unsigned_int> *local_60;
  reference local_58;
  _Node_iterator_base<std::pair<Kernel::Clause_*const,_Lib::Stack<Kernel::Literal_*>_>,_true>
  local_50;
  _Node_iterator_base<std::pair<Kernel::Clause_*const,_Lib::Stack<Kernel::Literal_*>_>,_true>
  local_48;
  vector<Kernel::Term_*,_std::allocator<Kernel::Term_*>_> *local_40;
  uint local_38;
  uint local_34;
  uint64_t local_30;
  TermAlgebra *local_28;
  Substitution *local_20;
  vector<Kernel::Term_*,_std::allocator<Kernel::Term_*>_> *local_10;
  
  local_20 = in_RCX;
  local_10 = in_RSI;
  sVar4 = std::vector<Kernel::Term_*,_std::allocator<Kernel::Term_*>_>::size(in_RSI);
  if (sVar4 < 2) {
    std::vector<Kernel::Term_*,_std::allocator<Kernel::Term_*>_>::operator[](local_10,0);
    local_30 = (uint64_t)Kernel::SortHelper::getResultSort(in_stack_fffffffffffffc78);
    sort._content._4_4_ = in_stack_fffffffffffffc04;
    sort._content._0_4_ = in_stack_fffffffffffffc00;
    local_28 = Kernel::Signature::getTermAlgebraOfSort(in_stack_fffffffffffffbf8,sort);
    local_34 = InductionContext::getFreeVariable
                         ((InductionContext *)
                          CONCAT44(in_stack_fffffffffffffcbc,in_stack_fffffffffffffcb8));
    local_38 = local_34 + 1;
    local_40 = local_10 + 1;
    local_48._M_cur =
         (__node_type *)
         std::
         unordered_map<Kernel::Clause_*,_Lib::Stack<Kernel::Literal_*>,_Inferences::StlClauseHash,_std::equal_to<Kernel::Clause_*>,_std::allocator<std::pair<Kernel::Clause_*const,_Lib::Stack<Kernel::Literal_*>_>_>_>
         ::begin((unordered_map<Kernel::Clause_*,_Lib::Stack<Kernel::Literal_*>,_Inferences::StlClauseHash,_std::equal_to<Kernel::Clause_*>,_std::allocator<std::pair<Kernel::Clause_*const,_Lib::Stack<Kernel::Literal_*>_>_>_>
                  *)in_stack_fffffffffffffbf8);
    local_50._M_cur =
         (__node_type *)
         std::
         unordered_map<Kernel::Clause_*,_Lib::Stack<Kernel::Literal_*>,_Inferences::StlClauseHash,_std::equal_to<Kernel::Clause_*>,_std::allocator<std::pair<Kernel::Clause_*const,_Lib::Stack<Kernel::Literal_*>_>_>_>
         ::end((unordered_map<Kernel::Clause_*,_Lib::Stack<Kernel::Literal_*>,_Inferences::StlClauseHash,_std::equal_to<Kernel::Clause_*>,_std::allocator<std::pair<Kernel::Clause_*const,_Lib::Stack<Kernel::Literal_*>_>_>_>
                *)in_stack_fffffffffffffbf8);
    while (bVar1 = std::__detail::operator!=(&local_48,&local_50), bVar1) {
      local_58 = std::__detail::
                 _Node_const_iterator<std::pair<Kernel::Clause_*const,_Lib::Stack<Kernel::Literal_*>_>,_false,_true>
                 ::operator*((_Node_const_iterator<std::pair<Kernel::Clause_*const,_Lib::Stack<Kernel::Literal_*>_>,_false,_true>
                              *)0x7d3f4b);
      uVar3 = Kernel::Clause::maxVar(in_stack_fffffffffffffc20);
      if (local_38 < uVar3 + 1) {
        local_38 = Kernel::Clause::maxVar(in_stack_fffffffffffffc20);
        local_38 = local_38 + 1;
      }
      std::__detail::
      _Node_const_iterator<std::pair<Kernel::Clause_*const,_Lib::Stack<Kernel::Literal_*>_>,_false,_true>
      ::operator++((_Node_const_iterator<std::pair<Kernel::Clause_*const,_Lib::Stack<Kernel::Literal_*>_>,_false,_true>
                    *)CONCAT44(in_stack_fffffffffffffc04,in_stack_fffffffffffffc00));
    }
    local_60 = Lib::List<unsigned_int>::empty();
    local_68 = Lib::List<unsigned_int>::empty();
    local_70 = Lib::List<unsigned_int>::empty();
    local_78 = Lib::List<Kernel::Formula_*>::empty();
    local_7c = 0;
    while( true ) {
      uVar3 = local_7c;
      uVar2 = Shell::TermAlgebra::nConstructors(local_28);
      con_00 = (Connective)((ulong)in_stack_fffffffffffffc18 >> 0x20);
      if (uVar2 <= uVar3) break;
      local_88 = Shell::TermAlgebra::constructor
                           ((TermAlgebra *)
                            CONCAT44(in_stack_fffffffffffffc04,in_stack_fffffffffffffc00),
                            (uint)((ulong)in_stack_fffffffffffffbf8 >> 0x20));
      local_8c = Shell::TermAlgebraConstructor::arity((TermAlgebraConstructor *)0x7d402e);
      Lib::Stack<Kernel::TermList>::Stack
                ((Stack<Kernel::TermList> *)in_stack_fffffffffffffc10,
                 (size_t)in_stack_fffffffffffffc08);
      in_stack_ffffffffffffff48 = (InductionClauseIterator *)Lib::List<Kernel::Formula_*>::empty();
      local_c8 = 0;
      while( true ) {
        bVar1 = SUB81((ulong)in_stack_fffffffffffffbf8 >> 0x18,0);
        uVar3 = (uint)((ulong)in_stack_fffffffffffffbf8 >> 0x20);
        if (local_8c <= local_c8) break;
        local_38 = local_38 + 1;
        in_stack_ffffffffffffff28._content = in_stack_ffffffffffffff30._content;
        Kernel::TermList::TermList
                  ((TermList *)CONCAT44(in_stack_fffffffffffffc04,in_stack_fffffffffffffc00),uVar3,
                   bVar1);
        elem._content._4_4_ = in_stack_fffffffffffffc04;
        elem._content._0_4_ = in_stack_fffffffffffffc00;
        in_stack_ffffffffffffff30._content = in_stack_ffffffffffffff28._content;
        Lib::Stack<Kernel::TermList>::push(&in_stack_fffffffffffffbf8->_dividesNvalues,elem);
        Kernel::TermList::var((TermList *)&stack0xffffffffffffff30);
        Lib::List<unsigned_int>::push
                  (in_stack_fffffffffffffc04,(List<unsigned_int> **)in_stack_fffffffffffffbf8);
        local_e0 = Shell::TermAlgebraConstructor::argSort
                             ((TermAlgebraConstructor *)in_stack_fffffffffffffbf8,0);
        local_e8 = Shell::TermAlgebraConstructor::rangeSort
                             ((TermAlgebraConstructor *)in_stack_fffffffffffffbf8);
        bVar1 = Kernel::TermList::operator==(&local_e0,&local_e8);
        if (bVar1) {
          local_38 = local_38 + 1;
          Kernel::TermList::TermList
                    ((TermList *)CONCAT44(in_stack_fffffffffffffc04,in_stack_fffffffffffffc00),
                     (uint)((ulong)in_stack_fffffffffffffbf8 >> 0x20),
                     SUB81((ulong)in_stack_fffffffffffffbf8 >> 0x18,0));
          Kernel::TermList::var(&local_f0);
          Lib::List<unsigned_int>::push
                    (in_stack_fffffffffffffc04,(List<unsigned_int> **)in_stack_fffffffffffffbf8);
          local_120 = local_128;
          local_118 = 1;
          std::allocator<Kernel::TermList>::allocator((allocator<Kernel::TermList> *)0x7d4222);
          __l._M_len = in_stack_fffffffffffffc40;
          __l._M_array = in_stack_fffffffffffffc38;
          std::vector<Kernel::TermList,_std::allocator<Kernel::TermList>_>::vector
                    ((vector<Kernel::TermList,_std::allocator<Kernel::TermList>_> *)
                     CONCAT17(in_stack_fffffffffffffc37,in_stack_fffffffffffffc30),__l,
                     in_stack_fffffffffffffc28);
          pFVar5 = InductionContext::getFormulaWithFreeVar
                             (in_stack_fffffffffffffc70,in_stack_fffffffffffffc68,
                              SUB81((ulong)in_stack_fffffffffffffc60 >> 0x38,0),
                              (uint)in_stack_fffffffffffffc60,in_stack_fffffffffffffc58,
                              (Substitution *)
                              CONCAT17(in_stack_fffffffffffffc57,in_stack_fffffffffffffc50));
          std::vector<Kernel::TermList,_std::allocator<Kernel::TermList>_>::~vector
                    ((vector<Kernel::TermList,_std::allocator<Kernel::TermList>_> *)
                     in_stack_fffffffffffffc10);
          std::allocator<Kernel::TermList>::~allocator((allocator<Kernel::TermList> *)0x7d429b);
          local_f8 = pFVar5;
          Lib::List<Kernel::Formula_*>::push
                    ((Formula *)CONCAT44(in_stack_fffffffffffffc04,in_stack_fffffffffffffc00),
                     (List<Kernel::Formula_*> **)in_stack_fffffffffffffbf8);
        }
        local_c8 = local_c8 + 1;
      }
      local_38 = local_38 + 1;
      Kernel::TermList::TermList
                ((TermList *)CONCAT44(in_stack_fffffffffffffc04,in_stack_fffffffffffffc00),uVar3,
                 bVar1);
      Kernel::TermList::var(local_138);
      Lib::List<unsigned_int>::push
                (in_stack_fffffffffffffc04,(List<unsigned_int> **)in_stack_fffffffffffffbf8);
      Shell::TermAlgebraConstructor::functor(local_88);
      Lib::Stack<Kernel::TermList>::size(&local_b0);
      Lib::Stack<Kernel::TermList>::begin(&local_b0);
      local_140 = Kernel::Term::create
                            (in_stack_fffffffffffffcbc,in_stack_fffffffffffffcb8,
                             in_stack_fffffffffffffcb0);
      Kernel::TermList::TermList
                ((TermList *)CONCAT44(in_stack_fffffffffffffc04,in_stack_fffffffffffffc00),
                 (Term *)in_stack_fffffffffffffbf8);
      local_170 = local_178;
      local_168 = 1;
      std::allocator<Kernel::TermList>::allocator((allocator<Kernel::TermList> *)0x7d446d);
      __l_00._M_len = in_stack_fffffffffffffc40;
      __l_00._M_array = in_stack_fffffffffffffc38;
      std::vector<Kernel::TermList,_std::allocator<Kernel::TermList>_>::vector
                ((vector<Kernel::TermList,_std::allocator<Kernel::TermList>_> *)
                 CONCAT17(in_stack_fffffffffffffc37,in_stack_fffffffffffffc30),__l_00,
                 in_stack_fffffffffffffc28);
      pFVar5 = InductionContext::getFormulaWithFreeVar
                         (in_stack_fffffffffffffc70,in_stack_fffffffffffffc68,
                          SUB81((ulong)in_stack_fffffffffffffc60 >> 0x38,0),
                          (uint)in_stack_fffffffffffffc60,in_stack_fffffffffffffc58,
                          (Substitution *)
                          CONCAT17(in_stack_fffffffffffffc57,in_stack_fffffffffffffc50));
      std::vector<Kernel::TermList,_std::allocator<Kernel::TermList>_>::~vector
                ((vector<Kernel::TermList,_std::allocator<Kernel::TermList>_> *)
                 in_stack_fffffffffffffc10);
      std::allocator<Kernel::TermList>::~allocator((allocator<Kernel::TermList> *)0x7d44e6);
      local_191 = 0;
      local_148 = pFVar5;
      bVar1 = Lib::List<unsigned_int>::isEmpty(local_68);
      if (bVar1) {
        local_318 = local_148;
      }
      else {
        local_318 = (Formula *)Kernel::BinaryFormula::operator_new(0x7d453d);
        local_191 = 1;
        local_190 = local_318;
        Kernel::JunctionFormula::generalJunction
                  ((Connective)((ulong)in_stack_fffffffffffffc28 >> 0x20),
                   (FormulaList *)in_stack_fffffffffffffc20);
        Kernel::BinaryFormula::BinaryFormula
                  (in_stack_fffffffffffffc10,(Connective)((ulong)in_stack_fffffffffffffc08 >> 0x20),
                   (Formula *)CONCAT44(in_stack_fffffffffffffc04,in_stack_fffffffffffffc00),
                   (Formula *)in_stack_fffffffffffffbf8);
      }
      local_188 = local_318;
      Lib::List<Kernel::Formula_*>::push
                ((Formula *)CONCAT44(in_stack_fffffffffffffc04,in_stack_fffffffffffffc00),
                 (List<Kernel::Formula_*> **)in_stack_fffffffffffffbf8);
      Lib::Stack<Kernel::TermList>::~Stack
                ((Stack<Kernel::TermList> *)
                 CONCAT44(in_stack_fffffffffffffc04,in_stack_fffffffffffffc00));
      local_7c = local_7c + 1;
    }
    pvVar6 = Kernel::JunctionFormula::operator_new(0x7d4691);
    Kernel::JunctionFormula::JunctionFormula
              ((JunctionFormula *)in_stack_fffffffffffffc10,
               (Connective)((ulong)in_stack_fffffffffffffc08 >> 0x20),
               (FormulaList *)CONCAT44(in_stack_fffffffffffffc04,in_stack_fffffffffffffc00));
    local_38 = local_38 + 1;
    local_1a0 = (ClauseStack *)pvVar6;
    Kernel::TermList::TermList
              ((TermList *)CONCAT44(in_stack_fffffffffffffc04,in_stack_fffffffffffffc00),
               (uint)((ulong)in_stack_fffffffffffffbf8 >> 0x20),
               SUB81((ulong)in_stack_fffffffffffffbf8 >> 0x18,0));
    local_1ac = local_38;
    local_38 = local_38 + 1;
    Kernel::TermList::TermList
              ((TermList *)CONCAT44(in_stack_fffffffffffffc04,in_stack_fffffffffffffc00),
               (uint)((ulong)in_stack_fffffffffffffbf8 >> 0x20),
               SUB81((ulong)in_stack_fffffffffffffbf8 >> 0x18,0));
    Kernel::Substitution::Substitution((Substitution *)0x7d472c);
    local_218 = local_1a8._content;
    local_210 = &local_218;
    local_208 = 1;
    std::allocator<Kernel::TermList>::allocator((allocator<Kernel::TermList> *)0x7d477d);
    __l_01._M_len = in_stack_fffffffffffffc40;
    __l_01._M_array = in_stack_fffffffffffffc38;
    std::vector<Kernel::TermList,_std::allocator<Kernel::TermList>_>::vector
              ((vector<Kernel::TermList,_std::allocator<Kernel::TermList>_> *)
               CONCAT17(in_stack_fffffffffffffc37,in_stack_fffffffffffffc30),__l_01,
               in_stack_fffffffffffffc28);
    pFVar5 = InductionContext::getFormulaWithFreeVar
                       (in_stack_fffffffffffffc70,in_stack_fffffffffffffc68,
                        SUB81((ulong)in_stack_fffffffffffffc60 >> 0x38,0),
                        (uint)in_stack_fffffffffffffc60,in_stack_fffffffffffffc58,
                        (Substitution *)
                        CONCAT17(in_stack_fffffffffffffc57,in_stack_fffffffffffffc50));
    std::vector<Kernel::TermList,_std::allocator<Kernel::TermList>_>::~vector
              ((vector<Kernel::TermList,_std::allocator<Kernel::TermList>_> *)
               in_stack_fffffffffffffc10);
    std::allocator<Kernel::TermList>::~allocator((allocator<Kernel::TermList> *)0x7d47f9);
    local_1e8 = pFVar5;
    pvVar6 = Kernel::BinaryFormula::operator_new(0x7d4813);
    Kernel::BinaryFormula::BinaryFormula
              (in_stack_fffffffffffffc10,(Connective)((ulong)in_stack_fffffffffffffc08 >> 0x20),
               (Formula *)CONCAT44(in_stack_fffffffffffffc04,in_stack_fffffffffffffc00),
               (Formula *)in_stack_fffffffffffffbf8);
    local_1a0 = (ClauseStack *)pvVar6;
    pvVar6 = Kernel::QuantifiedFormula::operator_new(0x7d485b);
    Lib::List<unsigned_int>::singleton((uint)((ulong)in_stack_fffffffffffffc10 >> 0x20));
    this_00 = Lib::List<Kernel::TermList>::empty();
    Kernel::QuantifiedFormula::QuantifiedFormula
              ((QuantifiedFormula *)in_stack_fffffffffffffc20,con_00,
               (VList *)in_stack_fffffffffffffc10,(SList *)in_stack_fffffffffffffc08,
               (Formula *)CONCAT44(in_stack_fffffffffffffc04,in_stack_fffffffffffffc00));
    local_1a0 = (ClauseStack *)pvVar6;
    cls = (ClauseStack *)Kernel::QuantifiedFormula::operator_new(0x7d48d0);
    uVar3 = Kernel::TermList::var(&local_1a8);
    Lib::List<unsigned_int>::singleton((uint)((ulong)in_stack_fffffffffffffc10 >> 0x20));
    Lib::List<Kernel::TermList>::empty();
    Kernel::QuantifiedFormula::QuantifiedFormula
              ((QuantifiedFormula *)in_stack_fffffffffffffc20,con_00,
               (VList *)in_stack_fffffffffffffc10,(SList *)in_stack_fffffffffffffc08,
               (Formula *)CONCAT44(in_stack_fffffffffffffc04,in_stack_fffffffffffffc00));
    local_1a0 = cls;
    pvVar6 = Kernel::QuantifiedFormula::operator_new(0x7d4955);
    Lib::List<Kernel::TermList>::empty();
    Kernel::QuantifiedFormula::QuantifiedFormula
              ((QuantifiedFormula *)in_stack_fffffffffffffc20,con_00,
               (VList *)in_stack_fffffffffffffc10,(SList *)in_stack_fffffffffffffc08,
               (Formula *)CONCAT44(in_stack_fffffffffffffc04,in_stack_fffffffffffffc00));
    local_1a0 = (ClauseStack *)pvVar6;
    bVar1 = Lib::List<unsigned_int>::isEmpty(local_68);
    if (!bVar1) {
      pvVar6 = Kernel::QuantifiedFormula::operator_new(0x7d49d0);
      Lib::List<Kernel::TermList>::empty();
      Kernel::QuantifiedFormula::QuantifiedFormula
                ((QuantifiedFormula *)in_stack_fffffffffffffc20,con_00,
                 (VList *)in_stack_fffffffffffffc10,(SList *)in_stack_fffffffffffffc08,
                 (Formula *)CONCAT44(in_stack_fffffffffffffc04,in_stack_fffffffffffffc00));
      local_1a0 = (ClauseStack *)pvVar6;
    }
    bVar1 = Lib::List<unsigned_int>::isEmpty(local_70);
    if (!bVar1) {
      pvVar6 = Kernel::QuantifiedFormula::operator_new(0x7d4bae);
      pLVar7 = local_70;
      this_01 = (QuantifiedFormula *)Lib::List<Kernel::TermList>::empty();
      Kernel::QuantifiedFormula::QuantifiedFormula
                (this_01,(Connective)((ulong)pLVar7 >> 0x20),(VList *)in_stack_fffffffffffffc10,
                 (SList *)in_stack_fffffffffffffc08,
                 (Formula *)CONCAT44(in_stack_fffffffffffffc04,in_stack_fffffffffffffc00));
      local_1a0 = (ClauseStack *)pvVar6;
    }
    Lib::DHMap<unsigned_int,_Kernel::Term_*,_Lib::DefaultHash,_Lib::DefaultHash2>::DHMap(&local_248)
    ;
    __len = 0x94;
    produceClauses(in_stack_ffffffffffffff48,in_stack_ffffffffffffff40,in_stack_ffffffffffffff3f,
                   (InductionContext *)in_stack_ffffffffffffff30._content,
                   (DHMap<unsigned_int,_Kernel::Term_*,_Lib::DefaultHash,_Lib::DefaultHash2> *)
                   in_stack_ffffffffffffff28._content);
    Lib::DHMap<unsigned_int,_Kernel::Term_*,_Lib::DefaultHash,_Lib::DefaultHash2>::get
              (in_stack_fffffffffffffc08,in_stack_fffffffffffffc04,(Term *)in_stack_fffffffffffffbf8
              );
    uVar2 = local_34;
    __addr = Kernel::SubstHelper::apply<Kernel::Substitution>
                       ((Term *)CONCAT44(local_34,in_stack_fffffffffffffc00),local_20,false);
    Kernel::Substitution::bind(local_20,uVar2,(sockaddr *)__addr,__len);
    Indexing::InductionFormulaIndex::Entry::add
              ((Entry *)this_00,cls,(Substitution *)CONCAT44(uVar3,in_stack_fffffffffffffc80));
    Lib::Stack<Kernel::Clause_*>::~Stack
              ((Stack<Kernel::Clause_*> *)CONCAT44(uVar2,in_stack_fffffffffffffc00));
    Lib::DHMap<unsigned_int,_Kernel::Term_*,_Lib::DefaultHash,_Lib::DefaultHash2>::~DHMap
              ((DHMap<unsigned_int,_Kernel::Term_*,_Lib::DefaultHash,_Lib::DefaultHash2> *)
               CONCAT44(uVar2,in_stack_fffffffffffffc00));
    Kernel::Substitution::~Substitution((Substitution *)0x7d4d26);
  }
  return;
}

Assistant:

void InductionClauseIterator::performStructInductionFreeVar(const InductionContext& context, InductionFormulaIndex::Entry* e, Substitution* freeVarSubst)
{
  if (context._indTerms.size() > 1) return;
  TermAlgebra* ta = env.signature->getTermAlgebraOfSort(SortHelper::getResultSort(context._indTerms[0]));
  unsigned freeVar = context.getFreeVariable(); // variable free in the induction literal
  unsigned var = freeVar+1; // used in the following to construct new variables
  for (const auto& kv : context._cls) {
    if (kv.first->maxVar() + 1 > var) {
      var = kv.first->maxVar() + 1;
    }
  }
  VList* us = VList::empty();
  VList* ws = VList::empty();
  VList* ys = VList::empty();
  FormulaList* formulas = FormulaList::empty();

  // Construct premise as a conjunction of steps.
  // Each step's antecedent contains a fresh free variable in place
  // of freeVar (collected in `ws`), each step's conclusion too (collected in `us`).
  for (unsigned i = 0; i < ta->nConstructors(); i++){
    TermAlgebraConstructor* con = ta->constructor(i);
    unsigned arity = con->arity();
    TermStack argTerms(arity); // Arguments of the step case antecedent: y_1, ..., y_arity
    FormulaList* hyps = FormulaList::empty();
    for (unsigned j = 0; j < arity; j++){
      TermList y(var++, false);
      argTerms.push(y);
      VList::push(y.var(), ys);
      if (con->argSort(j) == con->rangeSort()){
        TermList w(var++, false);
        VList::push(w.var(), ws);
        Formula* curLit = context.getFormulaWithFreeVar({ y }, true, freeVar, w);
        FormulaList::push(curLit, hyps); // L[y_j, w_j]
      }
    }
    TermList u(var++, false);
    VList::push(u.var(), us);
    Term* tcons = Term::create(con->functor(), (unsigned)argTerms.size(), argTerms.begin());
    Formula* consequent = context.getFormulaWithFreeVar({ TermList(tcons) }, true, freeVar, u);
    Formula* step = (VList::isEmpty(ws)) ? consequent :
      new BinaryFormula(Connective::IMP, JunctionFormula::generalJunction(Connective::AND, hyps), consequent); // (/\_{j ∈ P_c} L[y_j, w_j]) --> L[cons(y_1, ..., y_n), u_i]
    formulas->push(step, formulas);
  }
  Formula* formula = new JunctionFormula(Connective::AND, formulas);

  // Construct conclusion: L[z, x]
  TermList z(var++, false);
  const unsigned xvar = var;
  TermList x(var++, false);
  Substitution subst;
  Formula* conclusion = context.getFormulaWithFreeVar({ z }, true, freeVar, x, &subst);
  // Put together the whole induction axiom:
  formula = new BinaryFormula(Connective::IMP, formula, conclusion);
  formula = new QuantifiedFormula(Connective::EXISTS, VList::singleton(xvar), SList::empty(), formula);
  formula = new QuantifiedFormula(Connective::FORALL, VList::singleton(z.var()), SList::empty(), formula);
  formula = new QuantifiedFormula(Connective::FORALL, us, SList::empty(), formula);
  if (!VList::isEmpty(ws)) {
    formula = new QuantifiedFormula(Connective::EXISTS, ws, SList::empty(), formula);
  }
  if (!VList::isEmpty(ys)) {
    formula = new QuantifiedFormula(Connective::EXISTS, ys, SList::empty(), formula);
  }

  // Produce induction clauses and obtain the skolemization bindings.
  DHMap<unsigned, Term*> bindings;
  ClauseStack hyp_clauses = produceClauses(formula, InferenceRule::STRUCT_INDUCTION_AXIOM_ONE, context, &bindings); 
  // Bind freeVar to its corresponding skolem term in freeVarSubst.
  // This is used later in resolution.
  Term* xSkolem = bindings.get(xvar, nullptr);
  ASS(xSkolem != nullptr);
  ASS(freeVarSubst != nullptr);
  freeVarSubst->bind(int(freeVar), SubstHelper::apply<Substitution>(xSkolem, subst));

  e->add(std::move(hyp_clauses), std::move(subst));
  return;
}